

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingTests.cpp
# Opt level: O3

IterateResult __thiscall deqp::egl::GLES2SharingTest::iterate(GLES2SharingTest *this)

{
  ostringstream *poVar1;
  NativeDisplay *pNVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  deUint32 err;
  Library *egl;
  EGLDisplay pvVar6;
  NativeWindowFactory *pNVar7;
  EGLConfig config;
  undefined4 extraout_var;
  EGLSurface surface_00;
  EGLContext share;
  EGLContext context;
  char *description;
  UniqueDisplay display;
  Surface ref;
  UniqueSurface surface;
  EGLint attribList [7];
  UniqueDisplay UStack_208;
  NativeWindow *local_1f8;
  Surface local_1f0;
  TestLog *local_1d8;
  UniqueSurface local_1d0;
  undefined1 local_1b8 [392];
  
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  local_1d8 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pvVar6 = eglu::getAndInitDisplay
                     ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                      super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                      .m_data.ptr,(Version *)0x0);
  eglu::UniqueDisplay::UniqueDisplay(&UStack_208,egl,pvVar6);
  pNVar7 = eglu::selectNativeWindowFactory
                     (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplayFactory,
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
  local_1b8._16_4_ = 0x3021;
  local_1b8._20_8_ = 0x303800000001;
  local_1b8._0_8_ = (TestLog *)0x400003040;
  local_1b8._8_4_ = 0x3033;
  local_1b8._12_4_ = 4;
  config = eglu::chooseSingleConfig(egl,UStack_208.m_display,(EGLint *)local_1b8);
  pvVar6 = UStack_208.m_display;
  pNVar2 = (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
           super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.m_data.
           ptr;
  local_1b8._8_4_ =
       eglu::parseWindowVisibility
                 (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
  local_1b8._0_8_ = (TestLog *)0x1e0000001e0;
  iVar5 = (*(pNVar7->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                    (pNVar7,pNVar2,pvVar6,config);
  pvVar6 = UStack_208.m_display;
  local_1f8 = (NativeWindow *)CONCAT44(extraout_var,iVar5);
  surface_00 = eglu::createWindowSurface
                         ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                          super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                          .m_data.ptr,local_1f8,UStack_208.m_display,config,(EGLAttrib *)0x0);
  eglu::UniqueSurface::UniqueSurface(&local_1d0,egl,pvVar6,surface_00);
  local_1b8._0_8_ = this->m_log;
  poVar1 = (ostringstream *)(local_1b8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Create context A (share_context = EGL_NO_CONTEXT)",0x31);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x78));
  share = createContext(this,UStack_208.m_display,(EGLContext)0x0,config);
  local_1b8._0_8_ = this->m_log;
  poVar1 = (ostringstream *)(local_1b8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Create context B (share_context = context A)",0x2c);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x78));
  context = createContext(this,UStack_208.m_display,share,config);
  bVar3 = true;
  if ((this->m_spec).useResource == true) {
    local_1b8._0_8_ = this->m_log;
    poVar1 = (ostringstream *)(local_1b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Make current context A",0x16);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x78));
    makeCurrent(this,UStack_208.m_display,share,local_1d0.m_surface);
    local_1b8._0_8_ = this->m_log;
    poVar1 = (ostringstream *)(local_1b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Creating resource",0x11);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x78));
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
    bVar3 = true;
    if ((this->m_spec).renderOnContexA == true) {
      local_1b8._0_8_ = this->m_log;
      poVar1 = (ostringstream *)(local_1b8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Render resource",0xf);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x78));
      if ((this->m_spec).verifyOnContexA == true) {
        tcu::Surface::Surface((Surface *)local_1b8,0xf0,0xf0);
        tcu::Surface::Surface(&local_1f0,0xf0,0xf0);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])
                  (this,local_1b8,&local_1f0);
        bVar3 = tcu::fuzzyCompare(local_1d8,"Rendered image","Rendering result comparision",
                                  &local_1f0,(Surface *)local_1b8,0.05,COMPARE_LOG_RESULT);
        tcu::Surface::~Surface(&local_1f0);
        tcu::Surface::~Surface((Surface *)local_1b8);
      }
      else {
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(this,0,0);
      }
    }
    if ((this->m_spec).renderOnContexB == true) {
      local_1b8._0_8_ = this->m_log;
      poVar1 = (ostringstream *)(local_1b8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Make current context B",0x16);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x78));
      makeCurrent(this,UStack_208.m_display,context,local_1d0.m_surface);
      local_1b8._0_8_ = this->m_log;
      poVar1 = (ostringstream *)(local_1b8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Render resource",0xf);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x78));
      if ((this->m_spec).verifyOnContexB == true) {
        tcu::Surface::Surface((Surface *)local_1b8,0xf0,0xf0);
        tcu::Surface::Surface(&local_1f0,0xf0,0xf0);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])
                  (this,local_1b8,&local_1f0);
        bVar4 = tcu::fuzzyCompare(local_1d8,"Rendered image","Rendering result comparision",
                                  &local_1f0,(Surface *)local_1b8,0.05,COMPARE_LOG_RESULT);
        bVar3 = (bool)(bVar3 & bVar4);
        tcu::Surface::~Surface(&local_1f0);
        tcu::Surface::~Surface((Surface *)local_1b8);
      }
      else {
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(this,0,0);
      }
    }
    if ((this->m_spec).destroyOnContexB == true) {
      local_1b8._0_8_ = this->m_log;
      poVar1 = (ostringstream *)(local_1b8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Make current context B",0x16);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x78));
      makeCurrent(this,UStack_208.m_display,context,local_1d0.m_surface);
      local_1b8._0_8_ = this->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b8 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 8),"Destroy resource",0x10);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      local_1b8._0_8_ = this->m_log;
      poVar1 = (ostringstream *)(local_1b8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Make current context A",0x16);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x78));
      makeCurrent(this,UStack_208.m_display,share,local_1d0.m_surface);
      local_1b8._0_8_ = this->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b8 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 8),"Destroy resource",0x10);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x78));
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(this);
  }
  makeCurrent(this,UStack_208.m_display,(EGLContext)0x0,(EGLSurface)0x0);
  if ((this->m_spec).destroyContextBFirst == true) {
    local_1b8._0_8_ = this->m_log;
    poVar1 = (ostringstream *)(local_1b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Destroy context B",0x11);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x78));
    (*egl->_vptr_Library[0x13])(egl,UStack_208.m_display,context);
    local_1b8._0_8_ = this->m_log;
    poVar1 = (ostringstream *)(local_1b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Destroy context A",0x11);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x78));
    (*egl->_vptr_Library[0x13])(egl,UStack_208.m_display,share);
  }
  else {
    local_1b8._0_8_ = this->m_log;
    poVar1 = (ostringstream *)(local_1b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Destroy context A",0x11);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x78));
    (*egl->_vptr_Library[0x13])(egl,UStack_208.m_display,share);
    local_1b8._0_8_ = this->m_log;
    poVar1 = (ostringstream *)(local_1b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Destroy context B",0x11);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x78));
    (*egl->_vptr_Library[0x13])(egl,UStack_208.m_display,context);
  }
  err = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(err,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                   ,0x112);
  eglu::UniqueSurface::~UniqueSurface(&local_1d0);
  (*local_1f8->_vptr_NativeWindow[1])();
  description = "Image comparison failed";
  if (bVar3 != false) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(bVar3 ^ 1),
             description);
  eglu::UniqueDisplay::~UniqueDisplay(&UStack_208);
  return STOP;
}

Assistant:

TestCase::IterateResult GLES2SharingTest::iterate (void)
{
	const Library&						egl				= m_eglTestCtx.getLibrary();
	tcu::TestLog&						log				= m_testCtx.getLog();
	eglu::UniqueDisplay					display			(egl, eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay()));
	const eglu::NativeWindowFactory&	windowFactory	= eglu::selectNativeWindowFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());
	EGLConfig							config;
	bool								isOk			= true;
	EGLContext							contextA		= EGL_NO_CONTEXT;
	EGLContext							contextB		= EGL_NO_CONTEXT;

	{
		const EGLint attribList[] =
		{
			EGL_RENDERABLE_TYPE,	EGL_OPENGL_ES2_BIT,
			EGL_SURFACE_TYPE,		EGL_WINDOW_BIT,
			EGL_ALPHA_SIZE,			1,
			EGL_NONE
		};

		config = eglu::chooseSingleConfig(egl, *display, attribList);
	}

	try
	{
		de::UniquePtr<eglu::NativeWindow>	window	(windowFactory.createWindow(&m_eglTestCtx.getNativeDisplay(), *display, config, DE_NULL, eglu::WindowParams(480, 480, eglu::parseWindowVisibility(m_testCtx.getCommandLine()))));
		eglu::UniqueSurface					surface	(egl, *display, eglu::createWindowSurface(m_eglTestCtx.getNativeDisplay(), *window, *display, config, DE_NULL));

		m_log << tcu::TestLog::Message << "Create context A (share_context = EGL_NO_CONTEXT)" << tcu::TestLog::EndMessage;
		contextA = createContext(*display, EGL_NO_CONTEXT, config);

		m_log << tcu::TestLog::Message << "Create context B (share_context = context A)" << tcu::TestLog::EndMessage;
		contextB = createContext(*display, contextA, config);

		if (m_spec.useResource)
		{
			m_log << tcu::TestLog::Message << "Make current context A" << tcu::TestLog::EndMessage;
			makeCurrent(*display, contextA, *surface);
			m_log << tcu::TestLog::Message << "Creating resource" << tcu::TestLog::EndMessage;
			createResource();

			int		width	= 240;
			int		height	= 240;

			if (m_spec.renderOnContexA)
			{
				m_log << tcu::TestLog::Message << "Render resource" << tcu::TestLog::EndMessage;
				if (m_spec.verifyOnContexA)
				{
					tcu::Surface screen	(width, height);
					tcu::Surface ref	(width, height);
					renderResource(&screen, &ref);

					if (!fuzzyCompare(log, "Rendered image", "Rendering result comparision", ref, screen, 0.05f, tcu::COMPARE_LOG_RESULT))
						isOk = false;
				}
				else
				{
					renderResource(DE_NULL, DE_NULL);
				}
			}

			if (m_spec.renderOnContexB)
			{
				m_log << tcu::TestLog::Message << "Make current context B" << tcu::TestLog::EndMessage;
				makeCurrent(*display, contextB, *surface);
				m_log << tcu::TestLog::Message << "Render resource" << tcu::TestLog::EndMessage;
				if (m_spec.verifyOnContexB)
				{
					tcu::Surface screen	(width, height);
					tcu::Surface ref	(width, height);
					renderResource(&screen, &ref);

					if (!fuzzyCompare(log, "Rendered image", "Rendering result comparision", ref, screen, 0.05f, tcu::COMPARE_LOG_RESULT))
						isOk = false;
				}
				else
				{
					renderResource(DE_NULL, DE_NULL);
				}
			}

			if (m_spec.destroyOnContexB)
			{
				m_log << tcu::TestLog::Message << "Make current context B" << tcu::TestLog::EndMessage;
				makeCurrent(*display, contextB, *surface);
				m_log << tcu::TestLog::Message << "Destroy resource" << tcu::TestLog::EndMessage;
				destroyResource();
			}
			else
			{
				m_log << tcu::TestLog::Message << "Make current context A" << tcu::TestLog::EndMessage;
				makeCurrent(*display, contextA, *surface);
				m_log << tcu::TestLog::Message << "Destroy resource" << tcu::TestLog::EndMessage;
				destroyResource();
			}
		}

		makeCurrent(*display, EGL_NO_CONTEXT, EGL_NO_SURFACE);

		if (m_spec.destroyContextBFirst)
		{
			m_log << tcu::TestLog::Message << "Destroy context B" << tcu::TestLog::EndMessage;
			egl.destroyContext(*display, contextB);
			contextB = EGL_NO_CONTEXT;

			m_log << tcu::TestLog::Message << "Destroy context A" << tcu::TestLog::EndMessage;
			egl.destroyContext(*display, contextA);
			contextA = EGL_NO_CONTEXT;
		}
		else
		{
			m_log << tcu::TestLog::Message << "Destroy context A" << tcu::TestLog::EndMessage;
			egl.destroyContext(*display, contextA);
			contextA = EGL_NO_CONTEXT;

			m_log << tcu::TestLog::Message << "Destroy context B" << tcu::TestLog::EndMessage;
			egl.destroyContext(*display, contextB);
			contextB = EGL_NO_CONTEXT;
		}

		EGLU_CHECK(egl);
	}
	catch (...)
	{
		egl.makeCurrent(*display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT);
		if (contextA != EGL_NO_CONTEXT)
			egl.destroyContext(*display, contextA);
		if (contextB != EGL_NO_CONTEXT)
			egl.destroyContext(*display, contextB);
		throw;
	}

	if (isOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");

	return STOP;
}